

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O3

void * metacallt_object(void *obj,char *name,metacall_value_id ret,void **args,size_t size)

{
  metacall_value_id mVar1;
  type_id *args_00;
  method m;
  value pvVar2;
  size_t iterator;
  size_t sVar3;
  
  if (size == 0) {
    m = object_method((object)obj,name,ret,(type_id *)0x0,0);
  }
  else {
    args_00 = (type_id *)malloc(size * 4);
    sVar3 = 0;
    do {
      mVar1 = metacall_value_id(args[sVar3]);
      args_00[sVar3] = mVar1;
      sVar3 = sVar3 + 1;
    } while (size != sVar3);
    m = object_method((object)obj,name,ret,args_00,size);
    free(args_00);
  }
  if (m != (method)0x0) {
    pvVar2 = object_call((object)obj,m,args,size);
    return pvVar2;
  }
  log_write_impl_va("metacall",0x8d5,"metacallt_object",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                    ,LOG_LEVEL_ERROR,
                    "Method %s in object <%p> is not implemented with the parameter types being received"
                    ,name,obj);
  return (void *)0x0;
}

Assistant:

void *metacallt_object(void *obj, const char *name, const enum metacall_value_id ret, void *args[], size_t size)
{
	type_id *ids = NULL;

	if (size > 0)
	{
		ids = (type_id *)malloc(sizeof(type_id) * size);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			ids[iterator] = metacall_value_id(args[iterator]);
		}
	}

	method m = object_method(obj, name, ret, ids, size);

	if (ids != NULL)
	{
		free(ids);
	}

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Method %s in object <%p> is not implemented with the parameter types being received", name, obj);
		return NULL;
	}

	return object_call(obj, m, args, size);
}